

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::prepareTexture
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  GLint *pageSizeX;
  GLint *pageSizeY;
  GLint GVar1;
  int iVar2;
  TextureFormat TVar3;
  int iVar4;
  
  gl4cts::Texture::Generate(gl,texture);
  gl4cts::Texture::Bind(gl,*texture,target);
  GVar1 = SparseTextureUtils::getTargetDepth(target);
  (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
  super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.minDepth =
       GVar1;
  pageSizeX = &(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mState.pageSizeX;
  pageSizeY = &(this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mState.pageSizeY;
  SparseTextureUtils::getTexturePageSizes
            (gl,target,format,pageSizeX,pageSizeY,
             &(this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mState.pageSizeZ);
  if ((target == 0x8513) || (target == 0x9009)) {
    iVar4 = *pageSizeX;
    iVar2 = *pageSizeY;
    if (iVar2 < iVar4) {
      *pageSizeY = iVar4;
      iVar2 = iVar4;
    }
    else if (iVar4 < iVar2) {
      *pageSizeX = iVar2;
      iVar4 = iVar2;
    }
  }
  else {
    iVar4 = *pageSizeX;
    iVar2 = *pageSizeY;
  }
  (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
  super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.width =
       iVar4 << 2;
  (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
  super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.height =
       iVar2 << 2;
  (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
  super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.depth =
       (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
       super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.pageSizeZ
       * (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
         super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.
         minDepth * 4;
  TVar3 = glu::mapGLInternalFormat(format);
  (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
  super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.format = TVar3
  ;
  return true;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::prepareTexture(const Functions& gl, GLint target, GLint format,
														   GLuint& texture)
{
	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	mState.minDepth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ);

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (mState.pageSizeX > mState.pageSizeY)
			mState.pageSizeY = mState.pageSizeX;
		else if (mState.pageSizeX < mState.pageSizeY)
			mState.pageSizeX = mState.pageSizeY;
	}

	mState.width  = 4 * mState.pageSizeX;
	mState.height = 4 * mState.pageSizeY;
	mState.depth  = 4 * mState.pageSizeZ * mState.minDepth;

	mState.format = glu::mapGLInternalFormat(format);

	return true;
}